

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

void glslang::TIntermediate::updateOffset
               (TType *parentType,TType *memberType,int *offset,int *memberSize)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar3;
  int dummyStride;
  int local_34;
  
  iVar2 = (*memberType->_vptr_TType[0xb])(memberType);
  uVar3 = *(ulong *)(CONCAT44(extraout_var,iVar2) + 8);
  iVar2 = (*parentType->_vptr_TType[0xb])(parentType);
  bVar1 = *(byte *)(CONCAT44(extraout_var_00,iVar2) + 0x10);
  if (uVar3 >> 0x3d == 0) {
    iVar2 = (*parentType->_vptr_TType[0xb])(parentType);
    uVar3 = *(ulong *)(CONCAT44(extraout_var_01,iVar2) + 8);
  }
  iVar2 = getMemberAlignment(memberType,memberSize,&local_34,bVar1 & 0xf,
                             (uVar3 & 0xe000000000000000) == 0x2000000000000000);
  RoundToPow2<int>(offset,iVar2);
  return;
}

Assistant:

void TIntermediate::updateOffset(const TType& parentType, const TType& memberType, int& offset, int& memberSize)
{
    int dummyStride;

    // modify just the children's view of matrix layout, if there is one for this member
    TLayoutMatrix subMatrixLayout = memberType.getQualifier().layoutMatrix;
    int memberAlignment = getMemberAlignment(memberType, memberSize, dummyStride,
                                             parentType.getQualifier().layoutPacking,
                                             subMatrixLayout != ElmNone
                                                 ? subMatrixLayout == ElmRowMajor
                                                 : parentType.getQualifier().layoutMatrix == ElmRowMajor);
    RoundToPow2(offset, memberAlignment);
}